

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetri.cpp
# Opt level: O3

PlaneTriResult
planeTriIntersection
          (float *plane,float *triangle,uint tstride,float epsilon,float *front,uint *fcount,
          float *back,uint *bcount)

{
  float *p2;
  float *p2_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  float *pfVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float split [3];
  ulong local_68;
  undefined4 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  *fcount = 0;
  *bcount = 0;
  uVar10 = (ulong)tstride;
  p2 = (float *)((long)triangle + uVar10);
  uVar12 = (ulong)(tstride * 2);
  fVar1 = plane[1];
  fVar2 = *plane;
  fVar3 = plane[2];
  fVar4 = plane[3];
  p2_00 = (float *)((long)triangle + uVar12);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * triangle[1])),ZEXT416((uint)fVar2),
                            ZEXT416((uint)*triangle));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)((long)triangle + uVar10 + 4))),
                            ZEXT416((uint)fVar2),ZEXT416(*(uint *)((long)triangle + uVar10)));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)((long)triangle + uVar12 + 4))),
                            ZEXT416((uint)fVar2),ZEXT416(*(uint *)((long)triangle + uVar12)));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar3),ZEXT416((uint)triangle[2]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar3),
                            ZEXT416(*(uint *)((long)triangle + uVar10 + 8)));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar3),
                            ZEXT416(*(uint *)((long)triangle + uVar12 + 8)));
  fVar1 = fVar4 + auVar14._0_4_ + epsilon;
  fVar2 = fVar4 + auVar15._0_4_ + epsilon;
  fVar3 = fVar4 + auVar16._0_4_ + epsilon;
  bVar7 = fVar2 <= 0.0 == fVar1 <= 0.0;
  bVar8 = fVar3 <= 0.0 == fVar1 <= 0.0;
  local_58 = ZEXT416((uint)fVar3);
  if ((bVar7) && (bVar8)) {
    if (fVar1 <= 0.0) {
      add(triangle,back,tstride,bcount);
      add(p2,back,tstride,bcount);
      add(p2_00,back,tstride,bcount);
      return PTR_BACK;
    }
    add(triangle,front,tstride,fcount);
    add(p2,front,tstride,fcount);
    add(p2_00,front,tstride,fcount);
    return PTR_FRONT;
  }
  local_48 = ZEXT416((uint)fVar2);
  puVar11 = fcount;
  pfVar13 = front;
  if (bVar7) {
    if (fVar1 <= 0.0) {
      add(triangle,back,tstride,bcount);
      puVar11 = bcount;
      pfVar13 = back;
    }
    else {
      add(triangle,front,tstride,fcount);
    }
  }
  else {
    intersect(triangle,p2,(float *)&local_68,plane);
    if (fVar1 <= 0.0) {
      add(triangle,back,tstride,bcount);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_68;
      uVar10 = (ulong)(*bcount * tstride);
      uVar9 = *bcount + 1;
      *(ulong *)((long)back + uVar10) = local_68;
      *(undefined4 *)((long)back + uVar10 + 8) = local_60;
      *bcount = uVar9;
      if (4 < uVar9) goto LAB_0090db4a;
      uVar10 = (ulong)(*fcount * tstride);
      uVar9 = *fcount + 1;
      uVar5 = vmovlps_avx(auVar14);
      *(undefined8 *)((long)front + uVar10) = uVar5;
      *(undefined4 *)((long)front + uVar10 + 8) = local_60;
      *fcount = uVar9;
    }
    else {
      add(triangle,front,tstride,fcount);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_68;
      uVar10 = (ulong)(*fcount * tstride);
      uVar9 = *fcount + 1;
      *(ulong *)((long)front + uVar10) = local_68;
      *(undefined4 *)((long)front + uVar10 + 8) = local_60;
      *fcount = uVar9;
      if (4 < uVar9) goto LAB_0090db4a;
      uVar10 = (ulong)(*bcount * tstride);
      uVar9 = *bcount + 1;
      uVar5 = vmovlps_avx(auVar15);
      *(undefined8 *)((long)back + uVar10) = uVar5;
      *(undefined4 *)((long)back + uVar10 + 8) = local_60;
      *bcount = uVar9;
      pfVar13 = back;
      puVar11 = bcount;
    }
    if (4 < uVar9) goto LAB_0090db4a;
  }
  add(p2,pfVar13,tstride,puVar11);
  uVar5 = vcmpps_avx512vl(ZEXT816(0) << 0x40,local_58,5);
  uVar6 = vcmpps_avx512vl(ZEXT816(0) << 0x40,local_48,5);
  puVar11 = bcount;
  pfVar13 = back;
  if ((((ushort)uVar6 ^ (ushort)uVar5) & 1) == 0) {
    if (0.0 < local_58._0_4_) goto LAB_0090daa7;
  }
  else {
    intersect(p2,p2_00,(float *)&local_68,plane);
    uVar10 = (ulong)(*fcount * tstride);
    uVar9 = *fcount + 1;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_68;
    *(ulong *)((long)front + uVar10) = local_68;
    *(undefined4 *)((long)front + uVar10 + 8) = local_60;
    *fcount = uVar9;
    if ((float)local_58._0_4_ <= 0.0) {
      if (4 < uVar9) goto LAB_0090db4a;
      uVar10 = (ulong)(*bcount * tstride);
      uVar9 = *bcount + 1;
      uVar5 = vmovlps_avx(auVar16);
      *(undefined8 *)((long)back + uVar10) = uVar5;
      *(undefined4 *)((long)back + uVar10 + 8) = local_60;
      *bcount = uVar9;
      if (4 < uVar9) goto LAB_0090db4a;
    }
    else {
      if (4 < uVar9) goto LAB_0090db4a;
      uVar10 = (ulong)(*bcount * tstride);
      uVar9 = *bcount + 1;
      uVar5 = vmovlps_avx(auVar16);
      *(undefined8 *)((long)back + uVar10) = uVar5;
      *(undefined4 *)((long)back + uVar10 + 8) = local_60;
      *bcount = uVar9;
      if (4 < uVar9) goto LAB_0090db4a;
LAB_0090daa7:
      puVar11 = fcount;
      pfVar13 = front;
    }
  }
  add(p2_00,pfVar13,tstride,puVar11);
  if (bVar8) {
    return PTR_SPLIT;
  }
  intersect(p2_00,triangle,(float *)&local_68,plane);
  uVar10 = (ulong)(*fcount * tstride);
  uVar9 = *fcount + 1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_68;
  *(ulong *)((long)front + uVar10) = local_68;
  *(undefined4 *)((long)front + uVar10 + 8) = local_60;
  *fcount = uVar9;
  if (uVar9 < 5) {
    uVar10 = (ulong)(tstride * *bcount);
    uVar9 = *bcount + 1;
    uVar5 = vmovlps_avx(auVar17);
    *(undefined8 *)((long)back + uVar10) = uVar5;
    *(undefined4 *)((long)back + uVar10 + 8) = local_60;
    *bcount = uVar9;
    if (uVar9 < 5) {
      return PTR_SPLIT;
    }
  }
LAB_0090db4a:
  __assert_fail("pcount <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/planetri.cpp"
                ,0x49,"void add(const float *, float *, unsigned int, unsigned int &)");
}

Assistant:

PlaneTriResult planeTriIntersection(const float *plane,    // the plane equation in Ax+By+Cz+D format
                                    const float *triangle, // the source triangle.
                                    unsigned int tstride,  // stride in bytes of the input and output triangles
                                    float        epsilon,  // the co-planer epsilon value.
                                    float       *front,    // the triangle in front of the
                                    unsigned int &fcount,  // number of vertices in the 'front' triangle
                                    float       *back,     // the triangle in back of the plane
                                    unsigned int &bcount) // the number of vertices in the 'back' triangle.
{
  fcount = 0;
  bcount = 0;

  const char *tsource = (const char *) triangle;

  // get the three vertices of the triangle.
  const float *p1     = (const float *) (tsource);
  const float *p2     = (const float *) (tsource+tstride);
  const float *p3     = (const float *) (tsource+tstride*2);


  PlaneTriResult r1   = getSidePlane(p1,plane,epsilon); // compute the side of the plane each vertex is on
  PlaneTriResult r2   = getSidePlane(p2,plane,epsilon);
  PlaneTriResult r3   = getSidePlane(p3,plane,epsilon);

  if ( r1 == r2 && r1 == r3 ) // if all three vertices are on the same side of the plane.
  {
    if ( r1 == PTR_FRONT ) // if all three are in front of the plane, then copy to the 'front' output triangle.
    {
      add(p1,front,tstride,fcount);
      add(p2,front,tstride,fcount);
      add(p3,front,tstride,fcount);
    }
    else
    {
      add(p1,back,tstride,bcount); // if all three are in 'abck' then copy to the 'back' output triangle.
      add(p2,back,tstride,bcount);
      add(p3,back,tstride,bcount);
    }
    return r1; // if all three points are on the same side of the plane return result
  }

  // ok.. we need to split the triangle at the plane.

  // First test ray segment P1 to P2
  if ( r1 == r2 ) // if these are both on the same side...
  {
    if ( r1 == PTR_FRONT )
    {
      add( p1, front, tstride, fcount );
      add( p2, front, tstride, fcount );
    }
    else
    {
      add( p1, back, tstride, bcount );
      add( p2, back, tstride, bcount );
    }
  }
  else
  {
    float split[3]; // split the point
    intersect(p1,p2,split,plane);

    if ( r1 == PTR_FRONT )
    {

      add(p1, front, tstride, fcount );
      add(split, front, tstride, fcount );

      add(split, back, tstride, bcount );
      add(p2, back, tstride, bcount );

    }
    else
    {
      add(p1, back, tstride, bcount );
      add(split, back, tstride, bcount );

      add(split, front, tstride, fcount );
      add(p2, front, tstride, fcount );
    }

  }

  // Next test ray segment P2 to P3
  if ( r2 == r3 ) // if these are both on the same side...
  {
    if ( r3 == PTR_FRONT )
    {
      add( p3, front, tstride, fcount );
    }
    else
    {
      add( p3, back, tstride, bcount );
    }
  }
  else
  {
    float split[3]; // split the point
    intersect(p2,p3,split,plane);

    if ( r3 == PTR_FRONT )
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );

      add(p3, front, tstride, fcount );
    }
    else
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );

      add(p3, back, tstride, bcount );
    }
  }

  // Next test ray segment P3 to P1
  if ( r3 != r1 ) // if these are both on the same side...
  {
    float split[3]; // split the point

    intersect(p3,p1,split,plane);

    if ( r1 == PTR_FRONT )
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );
    }
    else
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );
    }
  }



  return PTR_SPLIT;
}